

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_OneLeak_TestShell::TEST_MemoryLeakDetectorTest_OneLeak_TestShell
          (TEST_MemoryLeakDetectorTest_OneLeak_TestShell *this)

{
  TEST_MemoryLeakDetectorTest_OneLeak_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)&PTR__TEST_MemoryLeakDetectorTest_OneLeak_TestShell_003e3428;
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, OneLeak)
{
    char* mem = detector->allocMemory(testAllocator, 3);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    STRCMP_CONTAINS("Memory leak(s) found", output.asCharString());
    STRCMP_CONTAINS("size: 3", output.asCharString());
    STRCMP_CONTAINS("alloc", output.asCharString());
    STRCMP_CONTAINS(StringFromFormat("%p", (void*) mem).asCharString(), output.asCharString());
    STRCMP_CONTAINS("Total number of leaks", output.asCharString());
    PlatformSpecificFree(mem);
    LONGS_EQUAL(1, testAllocator->alloc_called);
    LONGS_EQUAL(0, testAllocator->free_called);
}